

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O0

RK_S32 decode_nal_sei_frame_packing_arrangement(HEVCContext *s,BitReadCtx_t *gb)

{
  MPP_RET MVar1;
  RK_S32 local_38;
  RK_S32 local_34;
  RK_S32 _out_4;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_U32 _out;
  RK_S32 value;
  BitReadCtx_t *gb_local;
  HEVCContext *s_local;
  
  _out_1 = 0;
  __out = gb;
  gb_local = (BitReadCtx_t *)s;
  MVar1 = mpp_read_ue(gb,(RK_U32 *)&_out_2);
  __out->ret = MVar1;
  if (__out->ret == MPP_OK) {
    _out_1 = _out_2;
    MVar1 = mpp_read_bits(__out,1,&_out_3);
    __out->ret = MVar1;
    if (__out->ret == MPP_OK) {
      _out_1 = _out_3;
      gb_local[0x32].prevention_type = (uint)((_out_3 != 0 ^ 0xffU) & 1);
      if (gb_local[0x32].prevention_type != PSEUDO_CODE_NONE) {
        MVar1 = mpp_read_bits(__out,7,&_out_4);
        __out->ret = MVar1;
        if (__out->ret != MPP_OK) {
          return -0x3ec;
        }
        *(RK_S32 *)&gb_local[0x32].field_0x4c = _out_4;
        MVar1 = mpp_read_bits(__out,1,&local_34);
        __out->ret = MVar1;
        if (__out->ret != MPP_OK) {
          return -0x3ec;
        }
        *(RK_S32 *)((long)&gb_local[0x32].update_curbyte + 4) = local_34;
        MVar1 = mpp_read_bits(__out,6,&local_38);
        __out->ret = MVar1;
        if (__out->ret != MPP_OK) {
          return -0x3ec;
        }
        *(RK_S32 *)&gb_local[0x32].update_curbyte = local_38;
        MVar1 = mpp_skip_longbits(__out,6);
        __out->ret = MVar1;
        if (__out->ret != MPP_OK) {
          return -0x3ec;
        }
        if ((*(int *)((long)&gb_local[0x32].update_curbyte + 4) == 0) &&
           (*(int *)&gb_local[0x32].field_0x4c != 5)) {
          MVar1 = mpp_skip_longbits(__out,0x10);
          __out->ret = MVar1;
          if (__out->ret != MPP_OK) {
            return -0x3ec;
          }
        }
        MVar1 = mpp_skip_longbits(__out,8);
        __out->ret = MVar1;
        if (__out->ret != MPP_OK) {
          return -0x3ec;
        }
        MVar1 = mpp_skip_longbits(__out,1);
        __out->ret = MVar1;
        if (__out->ret != MPP_OK) {
          return -0x3ec;
        }
      }
      MVar1 = mpp_skip_longbits(__out,1);
      __out->ret = MVar1;
      if (__out->ret == MPP_OK) {
        return 0;
      }
    }
  }
  return -0x3ec;
}

Assistant:

static RK_S32 decode_nal_sei_frame_packing_arrangement(HEVCContext *s, BitReadCtx_t *gb)
{
    RK_S32 value = 0;

    READ_UE(gb, &value);                  // frame_packing_arrangement_id
    READ_ONEBIT(gb, &value);
    s->sei_frame_packing_present = !value;

    if (s->sei_frame_packing_present) {
        READ_BITS(gb, 7, &s->frame_packing_arrangement_type);
        READ_ONEBIT(gb, &s->quincunx_subsampling);
        READ_BITS(gb, 6, &s->content_interpretation_type);

        // the following skips spatial_flipping_flag frame0_flipped_flag
        // field_views_flag current_frame_is_frame0_flag
        // frame0_self_contained_flag frame1_self_contained_flag
        SKIP_BITS(gb, 6);

        if (!s->quincunx_subsampling && s->frame_packing_arrangement_type != 5)
            SKIP_BITS(gb, 16);  // frame[01]_grid_position_[xy]
        SKIP_BITS(gb, 8);       // frame_packing_arrangement_reserved_byte
        SKIP_BITS(gb, 1);        // frame_packing_arrangement_persistance_flag
    }
    SKIP_BITS(gb, 1);            // upsampled_aspect_ratio_flag
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}